

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

QModelIndex * __thiscall
QListView::moveCursor(QListView *this,CursorAction cursorAction,KeyboardModifiers modifiers)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  QListViewPrivate *this_00;
  undefined4 in_ECX;
  int in_EDX;
  long *in_RSI;
  QModelIndex *in_RDI;
  long in_FS_OFFSET;
  int row_2;
  int row_1;
  int row;
  QListViewPrivate *d;
  QModelIndex index;
  QModelIndex findindex;
  QList<QModelIndex> intersectVector;
  QSize contents;
  QRect rect;
  QRect initialRect;
  QModelIndex current;
  anon_class_8_1_54a39804 findAvailableRowForward;
  anon_class_8_1_54a39804 findAvailableRowBackward;
  int in_stack_fffffffffffffc88;
  int in_stack_fffffffffffffc8c;
  QListViewPrivate *in_stack_fffffffffffffc90;
  QAbstractItemModel *pQVar8;
  int in_stack_fffffffffffffc9c;
  QRect *in_stack_fffffffffffffca0;
  undefined4 in_stack_fffffffffffffca8;
  undefined4 in_stack_fffffffffffffcac;
  undefined4 in_stack_fffffffffffffcb0;
  undefined4 in_stack_fffffffffffffcb4;
  undefined4 in_stack_fffffffffffffcb8;
  undefined4 in_stack_fffffffffffffcbc;
  undefined4 in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcec;
  int in_stack_fffffffffffffcf0;
  int in_stack_fffffffffffffcf4;
  QListViewPrivate *this_01;
  QPersistentModelIndex local_278 [3];
  QPersistentModelIndex local_260 [6];
  undefined1 *local_230;
  undefined1 *local_228;
  QAbstractItemModel *local_220;
  QRect local_200;
  QRect local_1f0;
  QRect local_1e0;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  QAbstractItemModel *local_1c0;
  undefined4 local_1b4;
  undefined1 *local_198;
  undefined1 *local_190;
  QAbstractItemModel *local_188;
  QRect local_168;
  QRect local_158;
  QRect local_148;
  undefined1 *local_138;
  undefined1 *local_130;
  QAbstractItemModel *local_128;
  undefined4 local_11c;
  undefined1 *local_e8;
  undefined1 *puStack_e0;
  QListViewPrivate *local_d8;
  QSize local_d0;
  QSize local_c8;
  QSize local_c0;
  QPersistentModelIndex local_b8 [3];
  undefined8 local_a0;
  undefined8 local_98;
  undefined1 local_90 [16];
  QPersistentModelIndex local_80 [3];
  QPersistentModelIndex local_68 [3];
  QPersistentModelIndex local_50 [3];
  undefined1 *local_38;
  undefined1 *local_30;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_28;
  QListViewPrivate *local_20;
  QListViewPrivate *local_18;
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = in_ECX;
  this_00 = d_func((QListView *)0x87b3a7);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_28.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_20 = this_00;
  local_18 = this_00;
  QAbstractItemView::currentIndex((QAbstractItemView *)in_stack_fffffffffffffca0);
  bVar1 = QModelIndex::isValid((QModelIndex *)in_stack_fffffffffffffc90);
  if (bVar1) {
    if (((this_00->flow == LeftToRight) && (in_EDX == 2)) ||
       ((this_00->flow == TopToBottom && ((in_EDX == 0 || (in_EDX == 9)))))) {
      QModelIndex::row((QModelIndex *)&local_38);
      iVar3 = moveCursor::anon_class_8_1_54a39804::operator()
                        ((anon_class_8_1_54a39804 *)in_stack_fffffffffffffca0,
                         in_stack_fffffffffffffc9c);
      if (iVar3 == -1) {
        *(undefined1 **)in_RDI = local_38;
        in_RDI->i = (quintptr)local_30;
        (in_RDI->m).ptr = local_28.ptr;
      }
      else {
        pQVar8 = (this_00->super_QAbstractItemViewPrivate).model;
        iVar6 = this_00->column;
        QPersistentModelIndex::operator_cast_to_QModelIndex(local_68);
        (**(code **)(*(long *)pQVar8 + 0x60))(in_RDI,pQVar8,iVar3,iVar6,local_68);
      }
    }
    else if (((this_00->flow == LeftToRight) && (in_EDX == 3)) ||
            ((this_00->flow == TopToBottom && ((in_EDX == 1 || (in_EDX == 8)))))) {
      QModelIndex::row((QModelIndex *)&local_38);
      iVar3 = moveCursor::anon_class_8_1_54a39804::operator()
                        ((anon_class_8_1_54a39804 *)
                         CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                         (int)((ulong)in_stack_fffffffffffffca0 >> 0x20));
      if (iVar3 == -1) {
        *(undefined1 **)in_RDI = local_38;
        in_RDI->i = (quintptr)local_30;
        (in_RDI->m).ptr = local_28.ptr;
      }
      else {
        pQVar8 = (this_00->super_QAbstractItemViewPrivate).model;
        iVar6 = this_00->column;
        QPersistentModelIndex::operator_cast_to_QModelIndex(local_80);
        (**(code **)(*(long *)pQVar8 + 0x60))(in_RDI,pQVar8,iVar3,iVar6,local_80);
      }
    }
    else {
      local_90._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_90._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_90 = (undefined1  [16])
                 rectForIndex((QListView *)in_stack_fffffffffffffc90,
                              (QModelIndex *)
                              CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      local_a0 = local_90._0_8_;
      local_98 = local_90._8_8_;
      bVar1 = QRect::isEmpty((QRect *)in_stack_fffffffffffffc90);
      if (bVar1) {
        pQVar8 = (this_00->super_QAbstractItemViewPrivate).model;
        iVar3 = this_00->column;
        QPersistentModelIndex::operator_cast_to_QModelIndex(local_b8);
        (**(code **)(*(long *)pQVar8 + 0x60))(in_RDI,pQVar8,0,iVar3,local_b8);
      }
      else {
        local_c0 = QListViewPrivate::gridSize(in_stack_fffffffffffffc90);
        bVar1 = QSize::isValid((QSize *)in_stack_fffffffffffffca0);
        if (bVar1) {
          local_c8 = QListViewPrivate::gridSize(in_stack_fffffffffffffc90);
          QRect::setSize((QRect *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                         (QSize *)in_stack_fffffffffffffca0);
        }
        this_01 = (QListViewPrivate *)&DAT_aaaaaaaaaaaaaaaa;
        local_d0 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
        local_d0 = QListViewPrivate::contentsSize(in_stack_fffffffffffffc90);
        local_e8 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_e0 = &DAT_aaaaaaaaaaaaaaaa;
        local_d8 = this_01;
        QList<QModelIndex>::QList((QList<QModelIndex> *)0x87b90f);
        switch(in_EDX) {
        case 0:
        case 9:
          while (bVar1 = QList<QModelIndex>::isEmpty((QList<QModelIndex> *)0x87bf80), bVar1) {
            QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
            QRect::translate((QRect *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c,
                             in_stack_fffffffffffffc88);
            iVar3 = QRect::bottom((QRect *)0x87bfb6);
            if (iVar3 < 1) {
              *(undefined1 **)in_RDI = local_38;
              in_RDI->i = (quintptr)local_30;
              (in_RDI->m).ptr = local_28.ptr;
              goto LAB_0087c736;
            }
            iVar3 = QRect::top((QRect *)0x87c003);
            if (iVar3 < 0) {
              QRect::setTop((QRect *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c);
            }
            QListViewPrivate::intersectingSet
                      ((QListViewPrivate *)
                       CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                       (QRect *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                       SUB81((ulong)in_stack_fffffffffffffca0 >> 0x38,0));
            QList<QModelIndex>::operator=
                      ((QList<QModelIndex> *)in_stack_fffffffffffffc90,
                       (QList<QModelIndex> *)
                       CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
            QList<QModelIndex>::~QList((QList<QModelIndex> *)0x87c05b);
            QListViewPrivate::removeCurrentAndDisabled
                      ((QListViewPrivate *)
                       CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
                       (QList<QModelIndex> *)
                       CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                       (QModelIndex *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8))
            ;
          }
          QListViewPrivate::closestIndex
                    (this_01,(QRect *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                     (QList<QModelIndex> *)
                     CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
          break;
        case 1:
        case 8:
          while (bVar1 = QList<QModelIndex>::isEmpty((QList<QModelIndex> *)0x87c49e), bVar1) {
            QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
            QRect::translate((QRect *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c,
                             in_stack_fffffffffffffc88);
            iVar3 = QRect::top((QRect *)0x87c4d2);
            iVar6 = QSize::height((QSize *)0x87c4e3);
            if (iVar6 <= iVar3) {
              *(undefined1 **)in_RDI = local_38;
              in_RDI->i = (quintptr)local_30;
              (in_RDI->m).ptr = local_28.ptr;
              goto LAB_0087c736;
            }
            iVar6 = QRect::bottom((QRect *)0x87c535);
            iVar7 = QSize::height((QSize *)0x87c546);
            if (iVar7 < iVar6) {
              QSize::height((QSize *)0x87c55d);
              QRect::setBottom((QRect *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c);
            }
            QListViewPrivate::intersectingSet
                      ((QListViewPrivate *)CONCAT44(in_stack_fffffffffffffcb4,iVar3),
                       (QRect *)CONCAT44(iVar6,in_stack_fffffffffffffca8),
                       SUB81((ulong)in_stack_fffffffffffffca0 >> 0x38,0));
            QList<QModelIndex>::operator=
                      ((QList<QModelIndex> *)in_stack_fffffffffffffc90,
                       (QList<QModelIndex> *)
                       CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
            QList<QModelIndex>::~QList((QList<QModelIndex> *)0x87c5b0);
            QListViewPrivate::removeCurrentAndDisabled
                      ((QListViewPrivate *)
                       CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
                       (QList<QModelIndex> *)CONCAT44(in_stack_fffffffffffffcb4,iVar3),
                       (QModelIndex *)CONCAT44(iVar6,in_stack_fffffffffffffca8));
          }
          QListViewPrivate::closestIndex
                    (this_01,(QRect *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                     (QList<QModelIndex> *)
                     CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
          break;
        case 2:
          while (bVar1 = QList<QModelIndex>::isEmpty((QList<QModelIndex> *)0x87b94a), bVar1) {
            QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
            QRect::translate((QRect *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c,
                             in_stack_fffffffffffffc88);
            iVar3 = QRect::right((QRect *)0x87b980);
            if (iVar3 < 1) {
              *(undefined1 **)in_RDI = local_38;
              in_RDI->i = (quintptr)local_30;
              (in_RDI->m).ptr = local_28.ptr;
              goto LAB_0087c736;
            }
            iVar3 = QRect::left((QRect *)0x87b9cd);
            if (iVar3 < 0) {
              QRect::setLeft((QRect *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c);
            }
            QListViewPrivate::intersectingSet
                      ((QListViewPrivate *)
                       CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                       (QRect *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                       SUB81((ulong)in_stack_fffffffffffffca0 >> 0x38,0));
            QList<QModelIndex>::operator=
                      ((QList<QModelIndex> *)in_stack_fffffffffffffc90,
                       (QList<QModelIndex> *)
                       CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
            QList<QModelIndex>::~QList((QList<QModelIndex> *)0x87ba25);
            QListViewPrivate::removeCurrentAndDisabled
                      ((QListViewPrivate *)
                       CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
                       (QList<QModelIndex> *)
                       CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                       (QModelIndex *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8))
            ;
          }
          QListViewPrivate::closestIndex
                    (this_01,(QRect *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                     (QList<QModelIndex> *)
                     CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
          break;
        case 3:
          while (bVar1 = QList<QModelIndex>::isEmpty((QList<QModelIndex> *)0x87ba8b), bVar1) {
            QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
            QRect::translate((QRect *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c,
                             in_stack_fffffffffffffc88);
            in_stack_fffffffffffffcf4 = QRect::left((QRect *)0x87babf);
            iVar3 = QSize::width((QSize *)0x87bad0);
            if (iVar3 <= in_stack_fffffffffffffcf4) {
              *(undefined1 **)in_RDI = local_38;
              in_RDI->i = (quintptr)local_30;
              (in_RDI->m).ptr = local_28.ptr;
              goto LAB_0087c736;
            }
            in_stack_fffffffffffffcf0 = QRect::right((QRect *)0x87bb22);
            iVar3 = QSize::width((QSize *)0x87bb33);
            if (iVar3 < in_stack_fffffffffffffcf0) {
              QSize::width((QSize *)0x87bb4a);
              QRect::setRight((QRect *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c);
            }
            QListViewPrivate::intersectingSet
                      ((QListViewPrivate *)
                       CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                       (QRect *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                       SUB81((ulong)in_stack_fffffffffffffca0 >> 0x38,0));
            QList<QModelIndex>::operator=
                      ((QList<QModelIndex> *)in_stack_fffffffffffffc90,
                       (QList<QModelIndex> *)
                       CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
            QList<QModelIndex>::~QList((QList<QModelIndex> *)0x87bb9d);
            QListViewPrivate::removeCurrentAndDisabled
                      ((QListViewPrivate *)
                       CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
                       (QList<QModelIndex> *)
                       CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                       (QModelIndex *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8))
            ;
          }
          QListViewPrivate::closestIndex
                    (this_01,(QRect *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                     (QList<QModelIndex> *)
                     CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
          break;
        case 4:
          pQVar8 = (this_00->super_QAbstractItemViewPrivate).model;
          iVar3 = this_00->column;
          QPersistentModelIndex::operator_cast_to_QModelIndex(local_260);
          (**(code **)(*(long *)pQVar8 + 0x60))(in_RDI,pQVar8,0,iVar3,local_260);
          break;
        case 5:
          pQVar8 = (this_00->super_QAbstractItemViewPrivate).model;
          iVar6 = QListViewPrivate::batchStartRow(this_00);
          iVar3 = this_00->column;
          QPersistentModelIndex::operator_cast_to_QModelIndex(local_278);
          (**(code **)(*(long *)pQVar8 + 0x60))(in_RDI,pQVar8,iVar6 + -1,iVar3,local_278);
          break;
        case 6:
          iVar3 = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffc8c,
                                                  in_stack_fffffffffffffc88));
          iVar6 = QWidget::height((QWidget *)0x87bc19);
          if (iVar3 < iVar6) {
            QRect::top((QRect *)0x87bc70);
            QWidget::height((QWidget *)0x87bc88);
            QRect::moveTop(in_stack_fffffffffffffca0,in_stack_fffffffffffffc9c);
            iVar6 = QRect::top((QRect *)0x87bcab);
            iVar7 = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffc8c,
                                                    in_stack_fffffffffffffc88));
            if (iVar6 < iVar7) {
              QRect::setTop((QRect *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c);
              QRect::setBottom((QRect *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c);
            }
            local_138 = local_38;
            local_130 = local_30;
            local_128 = local_28.ptr;
            while( true ) {
              bVar2 = QList<QModelIndex>::isEmpty((QList<QModelIndex> *)0x87bd51);
              bVar1 = true;
              if (!bVar2) {
                local_148 = rectForIndex((QListView *)in_stack_fffffffffffffc90,
                                         (QModelIndex *)
                                         CONCAT44(in_stack_fffffffffffffc8c,
                                                  in_stack_fffffffffffffc88));
                iVar7 = QRect::top((QRect *)0x87bd94);
                local_158 = rectForIndex((QListView *)in_stack_fffffffffffffc90,
                                         (QModelIndex *)
                                         CONCAT44(in_stack_fffffffffffffc8c,
                                                  in_stack_fffffffffffffc88));
                iVar4 = QRect::bottom((QRect *)0x87bdca);
                local_168 = QWidget::rect((QWidget *)
                                          CONCAT44(in_stack_fffffffffffffcac,
                                                   in_stack_fffffffffffffca8));
                iVar5 = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffc8c,
                                                        in_stack_fffffffffffffc88));
                bVar1 = true;
                if (iVar4 - iVar5 < iVar7) {
                  iVar7 = QRect::top((QRect *)0x87be20);
                  bVar1 = iVar7 < 1;
                }
              }
              if (!bVar1) {
                *(undefined1 **)in_RDI = local_138;
                in_RDI->i = (quintptr)local_130;
                (in_RDI->m).ptr = local_128;
                goto LAB_0087c736;
              }
              QRect::translate((QRect *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c,
                               in_stack_fffffffffffffc88);
              iVar7 = QRect::bottom((QRect *)0x87be58);
              if (iVar7 < 1) break;
              QListViewPrivate::intersectingSet
                        ((QListViewPrivate *)
                         CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                         (QRect *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                         SUB81((ulong)in_stack_fffffffffffffca0 >> 0x38,0));
              QList<QModelIndex>::operator=
                        ((QList<QModelIndex> *)in_stack_fffffffffffffc90,
                         (QList<QModelIndex> *)
                         CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
              QList<QModelIndex>::~QList((QList<QModelIndex> *)0x87bedc);
              QListViewPrivate::closestIndex
                        (this_01,(QRect *)CONCAT44(in_stack_fffffffffffffcf4,
                                                   in_stack_fffffffffffffcf0),
                         (QList<QModelIndex> *)CONCAT44(iVar3,iVar6));
              local_138 = local_198;
              local_130 = local_190;
              local_128 = local_188;
            }
            *(undefined1 **)in_RDI = local_38;
            in_RDI->i = (quintptr)local_30;
            (in_RDI->m).ptr = local_28.ptr;
          }
          else {
            local_11c = local_c;
            (**(code **)(*in_RSI + 0x2a8))(in_RDI,in_RSI,0,local_c);
          }
          break;
        case 7:
          iVar3 = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffc8c,
                                                  in_stack_fffffffffffffc88));
          iVar6 = QWidget::height((QWidget *)0x87c0d7);
          if (iVar3 < iVar6) {
            QRect::top((QRect *)0x87c131);
            QWidget::height((QWidget *)0x87c149);
            QRect::moveTop(in_stack_fffffffffffffca0,in_stack_fffffffffffffc9c);
            iVar3 = QRect::bottom((QRect *)0x87c16c);
            iVar6 = QSize::height((QSize *)0x87c17d);
            iVar7 = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffc8c,
                                                    in_stack_fffffffffffffc88));
            if (iVar6 - iVar7 < iVar3) {
              QSize::height((QSize *)0x87c1ab);
              QRect::setTop((QRect *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c);
              QSize::height((QSize *)0x87c1ca);
              QRect::setBottom((QRect *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c);
            }
            local_1d0 = local_38;
            local_1c8 = local_30;
            local_1c0 = local_28.ptr;
            while( true ) {
              bVar2 = QList<QModelIndex>::isEmpty((QList<QModelIndex> *)0x87c243);
              bVar1 = true;
              if (!bVar2) {
                local_1e0 = rectForIndex((QListView *)in_stack_fffffffffffffc90,
                                         (QModelIndex *)
                                         CONCAT44(in_stack_fffffffffffffc8c,
                                                  in_stack_fffffffffffffc88));
                iVar3 = QRect::bottom((QRect *)0x87c286);
                local_1f0 = QWidget::rect((QWidget *)
                                          CONCAT44(in_stack_fffffffffffffcac,
                                                   in_stack_fffffffffffffca8));
                iVar6 = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffc8c,
                                                        in_stack_fffffffffffffc88));
                local_200 = rectForIndex((QListView *)in_stack_fffffffffffffc90,
                                         (QModelIndex *)
                                         CONCAT44(in_stack_fffffffffffffc8c,
                                                  in_stack_fffffffffffffc88));
                iVar7 = QRect::top((QRect *)0x87c2f1);
                bVar1 = true;
                if (iVar3 < iVar6 + iVar7) {
                  iVar3 = QRect::bottom((QRect *)0x87c312);
                  iVar6 = QSize::height((QSize *)0x87c323);
                  bVar1 = iVar6 < iVar3;
                }
              }
              if (!bVar1) {
                *(undefined1 **)in_RDI = local_1d0;
                in_RDI->i = (quintptr)local_1c8;
                (in_RDI->m).ptr = local_1c0;
                goto LAB_0087c736;
              }
              QRect::translate((QRect *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c,
                               in_stack_fffffffffffffc88);
              iVar3 = QRect::top((QRect *)0x87c360);
              iVar6 = QSize::height((QSize *)0x87c371);
              if (iVar6 <= iVar3) break;
              QListViewPrivate::intersectingSet
                        ((QListViewPrivate *)CONCAT44(iVar3,in_stack_fffffffffffffcb0),
                         (QRect *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                         SUB81((ulong)in_stack_fffffffffffffca0 >> 0x38,0));
              QList<QModelIndex>::operator=
                        ((QList<QModelIndex> *)in_stack_fffffffffffffc90,
                         (QList<QModelIndex> *)
                         CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
              QList<QModelIndex>::~QList((QList<QModelIndex> *)0x87c3fa);
              QListViewPrivate::closestIndex
                        (this_01,(QRect *)CONCAT44(in_stack_fffffffffffffcf4,
                                                   in_stack_fffffffffffffcf0),
                         (QList<QModelIndex> *)
                         CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
              local_1d0 = local_230;
              local_1c8 = local_228;
              local_1c0 = local_220;
            }
            *(undefined1 **)in_RDI = local_38;
            in_RDI->i = (quintptr)local_30;
            (in_RDI->m).ptr = local_28.ptr;
          }
          else {
            local_1b4 = local_c;
            (**(code **)(*in_RSI + 0x2a8))(in_RDI,in_RSI,1,local_c);
          }
          break;
        default:
          *(undefined1 **)in_RDI = local_38;
          in_RDI->i = (quintptr)local_30;
          (in_RDI->m).ptr = local_28.ptr;
        }
LAB_0087c736:
        QList<QModelIndex>::~QList((QList<QModelIndex> *)0x87c743);
      }
    }
  }
  else {
    iVar3 = moveCursor::anon_class_8_1_54a39804::operator()
                      ((anon_class_8_1_54a39804 *)
                       CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                       (int)((ulong)in_stack_fffffffffffffca0 >> 0x20));
    if (iVar3 == -1) {
      QModelIndex::QModelIndex((QModelIndex *)0x87b471);
    }
    else {
      pQVar8 = (this_00->super_QAbstractItemViewPrivate).model;
      iVar6 = this_00->column;
      QPersistentModelIndex::operator_cast_to_QModelIndex(local_50);
      (**(code **)(*(long *)pQVar8 + 0x60))(in_RDI,pQVar8,iVar3,iVar6,local_50);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QModelIndex QListView::moveCursor(CursorAction cursorAction, Qt::KeyboardModifiers modifiers)
{
    Q_D(QListView);
    Q_UNUSED(modifiers);

    auto findAvailableRowBackward = [d](int row) {
        while (row >= 0 && d->isHiddenOrDisabled(row))
            --row;
        return row;
    };

    auto findAvailableRowForward = [d](int row) {
        int rowCount = d->model->rowCount(d->root);
        if (!rowCount)
            return -1;
        while (row < rowCount && d->isHiddenOrDisabled(row))
            ++row;
        if (row >= rowCount)
            return -1;
        return row;
    };

    QModelIndex current = currentIndex();
    if (!current.isValid()) {
        int row = findAvailableRowForward(0);
        if (row == -1)
            return QModelIndex();
        return d->model->index(row, d->column, d->root);
    }

    if ((d->flow == LeftToRight && cursorAction == MoveLeft) ||
            (d->flow == TopToBottom && (cursorAction == MoveUp || cursorAction == MovePrevious))) {
        const int row = findAvailableRowBackward(current.row() - 1);
        if (row == -1)
            return current;
        return d->model->index(row, d->column, d->root);
    } else if ((d->flow == LeftToRight && cursorAction == MoveRight) ||
               (d->flow == TopToBottom && (cursorAction == MoveDown || cursorAction == MoveNext))) {
        const int row = findAvailableRowForward(current.row() + 1);
        if (row == -1)
            return current;
        return d->model->index(row, d->column, d->root);
    }

    const QRect initialRect = rectForIndex(current);
    QRect rect = initialRect;
    if (rect.isEmpty()) {
        return d->model->index(0, d->column, d->root);
    }
    if (d->gridSize().isValid()) rect.setSize(d->gridSize());

    QSize contents = d->contentsSize();
    QList<QModelIndex> intersectVector;

    switch (cursorAction) {
    case MoveLeft:
        while (intersectVector.isEmpty()) {
            rect.translate(-rect.width(), 0);
            if (rect.right() <= 0)
                return current;
            if (rect.left() < 0)
                rect.setLeft(0);
            intersectVector = d->intersectingSet(rect);
            d->removeCurrentAndDisabled(&intersectVector, current);
        }
        return d->closestIndex(initialRect, intersectVector);
    case MoveRight:
        while (intersectVector.isEmpty()) {
            rect.translate(rect.width(), 0);
            if (rect.left() >= contents.width())
                return current;
            if (rect.right() > contents.width())
                rect.setRight(contents.width());
            intersectVector = d->intersectingSet(rect);
            d->removeCurrentAndDisabled(&intersectVector, current);
        }
        return d->closestIndex(initialRect, intersectVector);
    case MovePageUp: {
        if (rect.height() >= d->viewport->height())
           return moveCursor(QAbstractItemView::MoveUp, modifiers);

        rect.moveTop(rect.top() - d->viewport->height() + 1);
        if (rect.top() < rect.height()) {
            rect.setTop(0);
            rect.setBottom(1);
        }
        QModelIndex findindex = current;
        while (intersectVector.isEmpty()
               || rectForIndex(findindex).top() <= (rectForIndex(current).bottom() - d->viewport->rect().height())
               || rect.top() <= 0) {
            rect.translate(0, 1);
            if (rect.bottom() <= 0) {
                return current;
            }
            intersectVector = d->intersectingSet(rect);
            findindex = d->closestIndex(initialRect, intersectVector);
        }
        return findindex;
    }
    case MovePrevious:
    case MoveUp:
        while (intersectVector.isEmpty()) {
            rect.translate(0, -rect.height());
            if (rect.bottom() <= 0) {
#ifdef QT_KEYPAD_NAVIGATION
                if (QApplicationPrivate::keypadNavigationEnabled()) {
                    int row = d->batchStartRow() - 1;
                    while (row >= 0 && d->isHiddenOrDisabled(row))
                        --row;
                    if (row >= 0)
                        return d->model->index(row, d->column, d->root);
                }
#endif
                return current;
            }
            if (rect.top() < 0)
                rect.setTop(0);
            intersectVector = d->intersectingSet(rect);
            d->removeCurrentAndDisabled(&intersectVector, current);
        }
        return d->closestIndex(initialRect, intersectVector);
    case MovePageDown: {
        if (rect.height() >= d->viewport->height())
           return moveCursor(QAbstractItemView::MoveDown, modifiers);

        rect.moveTop(rect.top() + d->viewport->height() - 1);
        if (rect.bottom() > contents.height() - rect.height()) {
            rect.setTop(contents.height() - 1);
            rect.setBottom(contents.height());
        }
        QModelIndex index = current;
        // index's bottom() - current's top() always <=  (d->viewport->rect().height()
        while (intersectVector.isEmpty()
               || rectForIndex(index).bottom() >= (d->viewport->rect().height() + rectForIndex(current).top())
               || rect.bottom() > contents.height()) {
            rect.translate(0, -1);
            if (rect.top() >= contents.height()) {
                return current;
            }
            intersectVector = d->intersectingSet(rect);
            index = d->closestIndex(initialRect, intersectVector);
        }
        return index;
    }
    case MoveNext:
    case MoveDown:
        while (intersectVector.isEmpty()) {
            rect.translate(0, rect.height());
            if (rect.top() >= contents.height()) {
#ifdef QT_KEYPAD_NAVIGATION
                if (QApplicationPrivate::keypadNavigationEnabled()) {
                    int rowCount = d->model->rowCount(d->root);
                    int row = 0;
                    while (row < rowCount && d->isHiddenOrDisabled(row))
                        ++row;
                    if (row < rowCount)
                        return d->model->index(row, d->column, d->root);
                }
#endif
                return current;
            }
            if (rect.bottom() > contents.height())
                rect.setBottom(contents.height());
            intersectVector = d->intersectingSet(rect);
            d->removeCurrentAndDisabled(&intersectVector, current);
        }
        return d->closestIndex(initialRect, intersectVector);
    case MoveHome:
        return d->model->index(0, d->column, d->root);
    case MoveEnd:
        return d->model->index(d->batchStartRow() - 1, d->column, d->root);}

    return current;
}